

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.hpp
# Opt level: O3

void __thiscall MIDIplay::MIDIchannel::MIDIchannel(MIDIchannel *this)

{
  pl_cell<MIDIplay::MIDIchannel::NoteInfo> *ppVar1;
  
  this->def_volume = 'd';
  this->def_bendsense_lsb = 0;
  this->def_bendsense_msb = 2;
  ppVar1 = (pl_cell<MIDIplay::MIDIchannel::NoteInfo> *)operator_new__(0x3800);
  (this->activenotes).cells_ = ppVar1;
  (this->activenotes).cells_allocd_ = true;
  (this->activenotes).capacity_ = 0x80;
  (this->activenotes).endcell_.next = (pl_cell<MIDIplay::MIDIchannel::NoteInfo> *)0x0;
  pl_list<MIDIplay::MIDIchannel::NoteInfo>::clear(&this->activenotes);
  this->gliding_note_count = 0;
  this->extended_note_count = 0;
  this->volume = this->def_volume;
  this->brightness = '\x7f';
  this->panning = '@';
  resetAllControllers121(this);
  this->patch = '\0';
  this->vibpos = 0.0;
  this->bank_lsb = '\0';
  this->bank_msb = '\0';
  this->lastlrpn = '\0';
  this->lastmrpn = '\0';
  this->nrpn = false;
  this->is_xg_percussion = false;
  return;
}

Assistant:

MIDIchannel() :
            def_volume(100),
            def_bendsense_lsb(0),
            def_bendsense_msb(2),
            activenotes(128)
        {
            gliding_note_count = 0;
            extended_note_count = 0;
            reset();
        }